

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_util.cpp
# Opt level: O0

ByteData256 *
cfd::core::HashUtil::Sha256
          (ByteData256 *__return_storage_ptr__,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *bytes)

{
  string *message;
  size_type bytes_len;
  CfdException *this;
  size_type len;
  undefined8 uVar1;
  allocator_type *in_stack_ffffffffffffff40;
  size_type in_stack_ffffffffffffff48;
  CfdError error_code;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff50;
  allocator local_81;
  string local_80 [32];
  CfdSourceLocation local_60;
  int local_48 [2];
  int ret;
  undefined1 local_30 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> output;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *bytes_local;
  
  output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)bytes;
  ::std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x3eb774);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  ::std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x3eb794);
  message = (string *)
            ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage);
  bytes_len = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                         output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage);
  this = (CfdException *)
         ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                   ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x3eb7c4);
  len = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
  local_48[0] = wally_sha256((uchar *)message,bytes_len,(uchar *)this,len);
  error_code = (CfdError)(bytes_len >> 0x20);
  if (local_48[0] != 0) {
    local_60.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_util.cpp"
                 ,0x2f);
    local_60.filename = local_60.filename + 1;
    local_60.line = 0x11c;
    local_60.funcname = "Sha256";
    logger::warn<int&>(&local_60,"wally_sha256 NG[{}].",local_48);
    uVar1 = __cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_80,"sha256 calc error.",&local_81);
    CfdException::CfdException(this,error_code,message);
    __cxa_throw(uVar1,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ByteData256::ByteData256
            (__return_storage_ptr__,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)message);
  return __return_storage_ptr__;
}

Assistant:

ByteData256 HashUtil::Sha256(const std::vector<uint8_t> &bytes) {
  std::vector<uint8_t> output(SHA256_LEN);

  // SHA256
  int ret =
      wally_sha256(bytes.data(), bytes.size(), output.data(), output.size());
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_sha256 NG[{}].", ret);
    throw CfdException(kCfdIllegalStateError, "sha256 calc error.");
  }

  return ByteData256(output);
}